

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

ExprP<tcu::Vector<float,_3>_> __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::FaceForward<3>::doExpand
          (FaceForward<3> *this,ExpandContext *param_1,ArgExprs *args)

{
  ExprP<tcu::Vector<float,_3>_> *in_RCX;
  SharedPtrStateBase *extraout_RDX;
  ExprP<tcu::Vector<float,_3>_> EVar1;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_3>_>_> SStack_58;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_48;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_38;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_> local_28;
  float local_14;
  
  dot<3>((Functions *)&local_38,in_RCX + 2,in_RCX + 1);
  local_14 = 0.0;
  constant<float>((BuiltinPrecisionTests *)&local_48,&local_14);
  operator<((BuiltinPrecisionTests *)&local_28,(ExprP<float> *)&local_38,(ExprP<float> *)&local_48);
  BuiltinPrecisionTests::operator-((BuiltinPrecisionTests *)&SStack_58,in_RCX);
  cond<tcu::Vector<float,3>>
            ((BuiltinPrecisionTests *)this,(ExprP<bool> *)&local_28,in_RCX,
             (ExprP<tcu::Vector<float,_3>_> *)&SStack_58);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_3>_>_>::release
            (&SStack_58);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_>::release(&local_28);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_48);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_38);
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_3>_>.super_ExprPBase<tcu::Vector<float,_3>_>.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_3>_>_>.m_state =
       extraout_RDX;
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_3>_>.super_ExprPBase<tcu::Vector<float,_3>_>.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_3>_>_>.m_ptr =
       (Expr<tcu::Vector<float,_3>_> *)this;
  return (ExprP<tcu::Vector<float,_3>_>)
         EVar1.super_ContainerExprPBase<tcu::Vector<float,_3>_>.
         super_ExprPBase<tcu::Vector<float,_3>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_3>_>_>;
}

Assistant:

ExprP<Ret>	doExpand	(ExpandContext&, const ArgExprs& args) const
	{
		return cond(dot(args.c, args.b) < constant(0.0f), args.a, -args.a);
	}